

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polar_extent_simd.hpp
# Opt level: O3

batch __thiscall
ear::PolarExtentCoreSimd<xsimd::sse2>::weight_from_cos
          (PolarExtentCoreSimd<xsimd::sse2> *this,PolarExtentCoreContext *ctx,batch cos_angle)

{
  undefined1 auVar1 [16];
  float fVar2;
  undefined4 in_EAX;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  float fVar12;
  float fVar14;
  undefined1 auVar13 [16];
  float fVar15;
  float fVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  float fVar19;
  float fVar22;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  float fVar23;
  float fVar25;
  undefined1 auVar24 [16];
  batch bVar26;
  batch bVar27;
  
  bVar27.super_simd_register<float,_xsimd::sse2>.data._8_8_ =
       cos_angle.super_simd_register<float,_xsimd::sse2>.data._8_8_;
  fVar2 = ctx->cos_start_angle;
  fVar12 = cos_angle.super_simd_register<float,_xsimd::sse2>.data[0];
  fVar14 = cos_angle.super_simd_register<float,_xsimd::sse2>.data[1];
  fVar15 = cos_angle.super_simd_register<float,_xsimd::sse2>.data[0];
  fVar16 = cos_angle.super_simd_register<float,_xsimd::sse2>.data[1];
  uVar4 = -(uint)(fVar12 < fVar2);
  uVar6 = -(uint)(fVar14 < fVar2);
  auVar18._4_4_ = uVar6;
  auVar18._0_4_ = uVar4;
  auVar18._8_4_ = -(uint)(fVar15 < fVar2);
  auVar18._12_4_ = -(uint)(fVar16 < fVar2);
  iVar3 = movmskps(in_EAX,auVar18);
  if (iVar3 == 0) {
    bVar27.super_simd_register<float,_xsimd::sse2>.data[0] = 1.0;
    bVar27.super_simd_register<float,_xsimd::sse2>.data[1] = 1.0;
    return (batch)bVar27.super_simd_register<float,_xsimd::sse2>.data;
  }
  fVar2 = ctx->cos_end_angle;
  auVar13._4_4_ = -(uint)(fVar2 < fVar14);
  auVar13._0_4_ = -(uint)(fVar2 < fVar12);
  auVar13._8_4_ = -(uint)(fVar2 < fVar15);
  auVar13._12_4_ = -(uint)(fVar2 < fVar16);
  iVar3 = movmskps(iVar3,auVar13);
  if (iVar3 != 0) {
    uVar5 = -(uint)(ABS(fVar12) <= 0.5);
    uVar7 = -(uint)(ABS(fVar14) <= 0.5);
    uVar8 = -(uint)(ABS(fVar15) <= 0.5);
    uVar10 = -(uint)(ABS(fVar16) <= 0.5);
    auVar17._0_4_ = ABS(fVar12) * 0.5;
    auVar17._4_4_ = ABS(fVar14) * 0.5;
    auVar17._8_4_ = ABS(fVar15) * 0.5;
    auVar17._12_4_ = ABS(fVar16) * 0.5;
    auVar20._0_4_ = 0.5 - auVar17._0_4_;
    auVar20._4_4_ = 0.5 - auVar17._4_4_;
    auVar20._8_4_ = 0.5 - auVar17._8_4_;
    auVar20._12_4_ = 0.5 - auVar17._12_4_;
    auVar18 = sqrtps(auVar17,auVar20);
    fVar23 = (float)((uint)fVar12 & uVar5 | ~uVar5 & auVar18._0_4_);
    fVar25 = (float)((uint)fVar14 & uVar7 | ~uVar7 & auVar18._4_4_);
    fVar19 = (float)((uint)fVar15 & uVar8 | ~uVar8 & auVar18._8_4_);
    fVar22 = (float)((uint)fVar16 & uVar10 | ~uVar10 & auVar18._12_4_);
    fVar15 = ABS(fVar23);
    fVar16 = ABS(fVar25);
    uVar8 = -(uint)(fVar15 <= 0.5);
    uVar10 = -(uint)(fVar16 <= 0.5);
    uVar9 = -(uint)(ABS(fVar19) <= 0.5);
    uVar11 = -(uint)(ABS(fVar22) <= 0.5);
    auVar24._0_4_ = (uint)(fVar23 * fVar23) & uVar8;
    auVar24._4_4_ = (uint)(fVar25 * fVar25) & uVar10;
    auVar24._8_4_ = (uint)(fVar19 * fVar19) & uVar9;
    auVar24._12_4_ = (uint)(fVar22 * fVar22) & uVar11;
    auVar21._0_4_ = ~uVar8 & (uint)((1.0 - fVar15) * 0.5);
    auVar21._4_4_ = ~uVar10 & (uint)((1.0 - fVar16) * 0.5);
    auVar21._8_4_ = ~uVar9 & (uint)((1.0 - ABS(fVar19)) * 0.5);
    auVar21._12_4_ = ~uVar11 & (uint)((1.0 - ABS(fVar22)) * 0.5);
    auVar21 = auVar21 | auVar24;
    auVar18 = sqrtps(auVar24,auVar21);
    fVar19 = auVar21._0_4_;
    fVar22 = auVar21._4_4_;
    fVar15 = (float)((uint)fVar15 & uVar8 | ~uVar8 & auVar18._0_4_);
    fVar16 = (float)((uint)fVar16 & uVar10 | ~uVar10 & auVar18._4_4_);
    fVar15 = fVar19 * fVar15 *
             ((((fVar19 * 0.0421632 + 0.024181312) * fVar19 + 0.045470025) * fVar19 + 0.074953005) *
              fVar19 + 0.16666752) + fVar15;
    fVar16 = fVar22 * fVar16 *
             ((((fVar22 * 0.0421632 + 0.024181312) * fVar22 + 0.045470025) * fVar22 + 0.074953005) *
              fVar22 + 0.16666752) + fVar16;
    fVar15 = (float)((~uVar8 & (uint)(1.5707964 - (fVar15 + fVar15)) | (uint)fVar15 & uVar8) ^
                    (uint)fVar23 & 0x80000000);
    fVar16 = (float)((~uVar10 & (uint)(1.5707964 - (fVar16 + fVar16)) | (uint)fVar16 & uVar10) ^
                    (uint)fVar25 & 0x80000000);
    fVar15 = (float)(~uVar5 & (uint)(fVar15 + fVar15) | (uint)fVar15 & uVar5);
    fVar16 = (float)(~uVar7 & (uint)(fVar16 + fVar16) | (uint)fVar16 & uVar7);
    fVar15 = (float)(~-(uint)(-0.5 <= fVar12) & (uint)(3.1415927 - fVar15) |
                    (uint)fVar15 & -(uint)(-0.5 <= fVar12));
    fVar16 = (float)(~-(uint)(-0.5 <= fVar14) & (uint)(3.1415927 - fVar16) |
                    (uint)fVar16 & -(uint)(-0.5 <= fVar14));
    bVar26.super_simd_register<float,_xsimd::sse2>.data._8_8_ =
         CONCAT44(~uVar6,~uVar4) & 0x3f8000003f800000;
    bVar26.super_simd_register<float,_xsimd::sse2>.data._0_8_ =
         CONCAT44(-(uint)(fVar2 < fVar14) & uVar6 &
                  (uint)(ctx->c + (float)(~uVar7 & (uint)fVar16 | (uint)(1.5707964 - fVar16) & uVar7
                                         ) * ctx->m),
                  -(uint)(fVar2 < fVar12) & uVar4 &
                  (uint)(ctx->c + (float)(~uVar5 & (uint)fVar15 | (uint)(1.5707964 - fVar15) & uVar5
                                         ) * ctx->m)) |
         bVar26.super_simd_register<float,_xsimd::sse2>.data._8_8_;
    return (batch)bVar26.super_simd_register<float,_xsimd::sse2>.data;
  }
  auVar1._8_8_ = 0;
  auVar1._0_8_ = cos_angle.super_simd_register<float,_xsimd::sse2>.data._0_8_;
  return (simd_register<float,_xsimd::sse2>)(auVar1 << 0x40);
}

Assistant:

batch weight_from_cos(PolarExtentCoreContext &ctx, batch cos_angle) const {
      auto start = cos_angle >= ctx.cos_start_angle;
      auto end = cos_angle <= ctx.cos_end_angle;
      if (xsimd::all(start)) return batch{1.0};
      if (xsimd::all(end)) return batch{0.0};

      auto ramp = ctx.m * xsimd::acos(cos_angle) + ctx.c;
      return xsimd::select(start, batch{1.0},
                           xsimd::select(end, batch{0.0}, ramp));
    }